

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

int Gia_MuxDeref(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  uint iObj_00;
  int iVar5;
  Gia_Obj_t *pGVar6;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if ((p->pMuxes == (uint *)0x0) || (p->pMuxes[(uint)iObj] == 0)) {
    __assert_fail("Gia_ObjIsMuxId(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMuxes.c"
                  ,0x155,"int Gia_MuxDeref(Gia_Man_t *, int)");
  }
  if (iObj < p->nObjs) {
    pGVar6 = p->pObjs + (uint)iObj;
    iVar3 = Gia_MuxDeref_rec(p,iObj - (*(uint *)pGVar6 & 0x1fffffff));
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar6) && (pGVar6 < pGVar2 + p->nObjs)) {
      iVar4 = Gia_MuxDeref_rec(p,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555 -
                                 (*(uint *)&pGVar6->field_0x4 & 0x1fffffff));
      iObj_00 = 0xffffffff;
      if (p->pMuxes != (uint *)0x0) {
        pGVar2 = p->pObjs;
        if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) goto LAB_0021f9a1;
        uVar1 = p->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555];
        if (uVar1 != 0) {
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          iObj_00 = uVar1 >> 1;
        }
      }
      iVar5 = Gia_MuxDeref_rec(p,iObj_00);
      return iVar5 + iVar3 + iVar4 + 1;
    }
  }
LAB_0021f9a1:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_MuxDeref( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    assert( Gia_ObjIsMuxId(p, iObj) );
    return Gia_MuxDeref_rec( p, Gia_ObjFaninId0p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId1p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId2p(p, pObj) ) + 1;
}